

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

VTimeZone * icu_63::VTimeZone::createVTimeZoneByID(UnicodeString *ID)

{
  short sVar1;
  int32_t srcLength;
  VTimeZone *this;
  TimeZone *pTVar2;
  UResourceBundle *resB;
  UChar *srcChars;
  int32_t length;
  size_t in_RSI;
  int32_t len;
  UErrorCode status;
  int32_t local_38;
  UErrorCode local_34;
  
  this = (VTimeZone *)UMemory::operator_new((UMemory *)0x120,in_RSI);
  if (this != (VTimeZone *)0x0) {
    BasicTimeZone::BasicTimeZone((BasicTimeZone *)this);
    (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject =
         (_func_int **)&PTR__VTimeZone_003a4750;
    this->tz = (BasicTimeZone *)0x0;
    this->vtzlines = (UVector *)0x0;
    (this->tzurl).super_Replaceable.super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003b2258;
    (this->tzurl).fUnion.fStackFields.fLengthAndFlags = 2;
    this->lastmod = 1.838821689216e+17;
    (this->olsonzid).super_Replaceable.super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003b2258;
    (this->olsonzid).fUnion.fStackFields.fLengthAndFlags = 2;
    (this->icutzver).super_Replaceable.super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003b2258;
    (this->icutzver).fUnion.fStackFields.fLengthAndFlags = 2;
  }
  pTVar2 = TimeZone::createTimeZone(ID);
  this->tz = (BasicTimeZone *)pTVar2;
  UnicodeString::operator=(&this->olsonzid,&pTVar2->fID);
  _local_38 = 0;
  resB = ures_openDirect_63((char *)0x0,"zoneinfo64",&local_34);
  srcChars = ures_getStringByKey_63(resB,"TZVersion",&local_38,&local_34);
  if (local_34 < U_ILLEGAL_ARGUMENT_ERROR) {
    srcLength = local_38;
    UnicodeString::unBogus(&this->icutzver);
    sVar1 = (this->icutzver).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      length = (this->icutzver).fUnion.fFields.fLength;
    }
    else {
      length = (int)sVar1 >> 5;
    }
    UnicodeString::doReplace(&this->icutzver,0,length,srcChars,0,srcLength);
  }
  ures_close_63(resB);
  return this;
}

Assistant:

VTimeZone*
VTimeZone::createVTimeZoneByID(const UnicodeString& ID) {
    VTimeZone *vtz = new VTimeZone();
    vtz->tz = (BasicTimeZone*)TimeZone::createTimeZone(ID);
    vtz->tz->getID(vtz->olsonzid);

    // Set ICU tzdata version
    UErrorCode status = U_ZERO_ERROR;
    UResourceBundle *bundle = NULL;
    const UChar* versionStr = NULL;
    int32_t len = 0;
    bundle = ures_openDirect(NULL, "zoneinfo64", &status);
    versionStr = ures_getStringByKey(bundle, "TZVersion", &len, &status);
    if (U_SUCCESS(status)) {
        vtz->icutzver.setTo(versionStr, len);
    }
    ures_close(bundle);
    return vtz;
}